

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O3

JoystickState * __thiscall
sf::priv::JoystickImpl::update(JoystickState *__return_storage_ptr__,JoystickImpl *this)

{
  undefined3 uVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  long lVar5;
  JoystickState *pJVar6;
  JoystickState *pJVar7;
  bool bVar8;
  byte bVar9;
  float fVar10;
  js_event joyState;
  undefined1 local_64 [3];
  undefined8 local_61;
  undefined8 uStack_59;
  undefined8 local_51;
  undefined8 uStack_49;
  undefined8 local_41;
  undefined8 uStack_39;
  undefined8 local_31;
  undefined8 uStack_29;
  
  bVar9 = 0;
  pJVar7 = __return_storage_ptr__;
  if (this->m_file < 0) {
    local_31 = 0;
    uStack_29 = 0;
    local_41 = 0;
    uStack_39 = 0;
    local_51 = 0;
    uStack_49 = 0;
    local_61 = 0;
    uStack_59 = 0;
    pJVar6 = &this->m_state;
    (this->m_state).connected = false;
    memcpy(&(this->m_state).field_0x1,local_64,0x43);
    lVar5 = 0x11;
  }
  else {
    sVar3 = read(this->m_file,local_64,8);
    iVar2 = (int)sVar3;
    if (0 < iVar2) {
      do {
        if ((local_61._3_1_ & 0x7f) == 1) {
          if ((ulong)local_61._4_1_ < 0x20) {
            (this->m_state).buttons[local_61._4_1_] = local_61._1_2_ != 0;
          }
        }
        else if ((local_61._3_1_ & 0x7f) == 2) {
          fVar10 = ((float)(int)local_61._1_2_ * 100.0) / 32767.0;
          if ((ulong)local_61._4_1_ < 0x40) {
            switch(this->m_mapping[local_61._4_1_]) {
            case '\0':
              (this->m_state).axes[0] = fVar10;
              break;
            case '\x01':
              (this->m_state).axes[1] = fVar10;
              break;
            case '\x02':
            case '\x06':
              (this->m_state).axes[2] = fVar10;
              break;
            case '\x03':
              (this->m_state).axes[4] = fVar10;
              break;
            case '\x04':
              (this->m_state).axes[5] = fVar10;
              break;
            case '\x05':
            case '\a':
              (this->m_state).axes[3] = fVar10;
              break;
            case '\x10':
              (this->m_state).axes[6] = fVar10;
              break;
            case '\x11':
              (this->m_state).axes[7] = fVar10;
            }
          }
        }
        sVar3 = read(this->m_file,local_64,8);
        iVar2 = (int)sVar3;
      } while (0 < iVar2);
    }
    if (iVar2 == 0) {
      bVar8 = true;
    }
    else {
      piVar4 = __errno_location();
      bVar8 = *piVar4 == 0xb;
    }
    (this->m_state).connected = bVar8;
    lVar5 = 0x11;
    pJVar6 = &this->m_state;
  }
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    uVar1 = *(undefined3 *)&pJVar6->field_0x1;
    pJVar7->connected = pJVar6->connected;
    *(undefined3 *)&pJVar7->field_0x1 = uVar1;
    pJVar6 = (JoystickState *)((long)pJVar6 + (ulong)bVar9 * -8 + 4);
    pJVar7 = (JoystickState *)((long)pJVar7 + (ulong)bVar9 * -8 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

JoystickState JoystickImpl::JoystickImpl::update()
{
    if (m_file < 0)
    {
        m_state = JoystickState();
        return m_state;
    }

    // pop events from the joystick file
    js_event joyState;
    int result = read(m_file, &joyState, sizeof(joyState));
    while (result > 0)
    {
        switch (joyState.type & ~JS_EVENT_INIT)
        {
            // An axis was moved
            case JS_EVENT_AXIS:
            {
                float value = joyState.value * 100.f / 32767.f;

                if (joyState.number < ABS_MAX + 1)
                {
                    switch (m_mapping[joyState.number])
                    {
                        case ABS_X:        m_state.axes[Joystick::X]    = value; break;
                        case ABS_Y:        m_state.axes[Joystick::Y]    = value; break;
                        case ABS_Z:
                        case ABS_THROTTLE: m_state.axes[Joystick::Z]    = value; break;
                        case ABS_RZ:
                        case ABS_RUDDER:   m_state.axes[Joystick::R]    = value; break;
                        case ABS_RX:       m_state.axes[Joystick::U]    = value; break;
                        case ABS_RY:       m_state.axes[Joystick::V]    = value; break;
                        case ABS_HAT0X:    m_state.axes[Joystick::PovX] = value; break;
                        case ABS_HAT0Y:    m_state.axes[Joystick::PovY] = value; break;
                        default:           break;
                    }
                }
                break;
            }

            // A button was pressed
            case JS_EVENT_BUTTON:
            {
                if (joyState.number < Joystick::ButtonCount)
                    m_state.buttons[joyState.number] = (joyState.value != 0);
                break;
            }
        }

        result = read(m_file, &joyState, sizeof(joyState));
    }

    // Check the connection state of the joystick
    // read() returns -1 and errno != EGAIN if it's no longer connected
    // We need to check the result of read() as well, since errno could
    // have been previously set by some other function call that failed
    // result can be either negative or 0 at this point
    // If result is 0, assume the joystick is still connected
    // If result is negative, check errno and disconnect if it is not EAGAIN
    m_state.connected = (!result || (errno == EAGAIN));

    return m_state;
}